

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O2

void __thiscall Simulator::push_real(Simulator *this,PCode *code)

{
  bool bVar1;
  Symbol *pSVar2;
  string *str;
  Symbol symbol;
  undefined1 local_e8 [40];
  pointer local_c0;
  pointer local_b8;
  pointer pSStack_b0;
  pointer local_a8;
  double local_88;
  StackSymbol local_60;
  
  str = &code->first_;
  bVar1 = Recognition::is_real(str);
  if (bVar1) {
    local_c0 = (pointer)std::__cxx11::stod(str,(size_t *)0x0);
    local_e8._0_4_ = kReal;
    local_e8._16_8_ = (pointer)0x0;
    local_e8._24_8_ = (pointer)0x0;
    local_e8._32_8_ = (pointer)0x0;
    local_b8 = (pointer)0x0;
    pSStack_b0 = (pointer)0x0;
    local_a8 = (pointer)0x0;
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
              (&this->stack_,(StackSymbol *)local_e8);
    StackSymbol::UnionValue::~UnionValue(local_e8 + 8);
  }
  else {
    pSVar2 = ScopeTree::resolve(&this->tree_,str);
    Symbol::Symbol((Symbol *)local_e8,pSVar2);
    local_60.type_ = kReal;
    local_60.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_60.value_.int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_60.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_60.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_60.value_.real_value = local_88;
    std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
              (&this->stack_,&local_60);
    StackSymbol::UnionValue::~UnionValue(&local_60.value_);
    Symbol::~Symbol((Symbol *)local_e8);
  }
  this->eip_ = this->eip_ + 1;
  return;
}

Assistant:

void Simulator::push_real(const PCode &code) {
    if (Recognition::is_real(code.first())) {
        stack_.push_back(StackSymbol(std::stod(code.first())));
    } else {
        Symbol symbol = tree_.resolve(code.first());
        stack_.push_back(StackSymbol(symbol.real_value()));
    }
    inc_eip();
}